

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupportTest_setDataObject_Test::testBody(TEST_MockSupportTest_setDataObject_Test *this)

{
  MockSupport *pMVar1;
  UtestShell *pUVar2;
  void *pvVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  SimpleString local_90;
  undefined1 local_80 [112];
  
  SimpleString::SimpleString((SimpleString *)(local_80 + 0x20),"");
  pMVar1 = mock((SimpleString *)(local_80 + 0x20),(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)local_80,"data");
  SimpleString::SimpleString(&local_90,"type");
  MockSupport::setDataObject(pMVar1,(SimpleString *)local_80,&local_90,(void *)0x1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString((SimpleString *)local_80);
  SimpleString::~SimpleString((SimpleString *)(local_80 + 0x20));
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)local_80,"");
  pMVar1 = mock((SimpleString *)local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"data");
  MockSupport::getData((MockNamedValue *)(local_80 + 0x20),pMVar1,&local_90);
  pvVar3 = MockNamedValue::getObjectPointer((MockNamedValue *)(local_80 + 0x20));
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x13])
            (pUVar2,1,pvVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x87,pTVar4);
  MockNamedValue::~MockNamedValue((MockNamedValue *)(local_80 + 0x20));
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString((SimpleString *)local_80);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_90,"");
  pMVar1 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)(local_80 + 0x10),"data");
  MockSupport::getData((MockNamedValue *)(local_80 + 0x20),pMVar1,(SimpleString *)(local_80 + 0x10))
  ;
  MockNamedValue::getType((MockNamedValue *)local_80);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_80);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"type",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x88,pTVar4);
  SimpleString::~SimpleString((SimpleString *)local_80);
  MockNamedValue::~MockNamedValue((MockNamedValue *)(local_80 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_80 + 0x10));
  SimpleString::~SimpleString(&local_90);
  return;
}

Assistant:

TEST(MockSupportTest, setDataObject)
{
    void * ptr = (void*) 0x001;
    mock().setDataObject("data", "type", ptr);
    POINTERS_EQUAL(ptr, mock().getData("data").getObjectPointer());
    STRCMP_EQUAL("type", mock().getData("data").getType().asCharString());
}